

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall
re2::Prog::ComputeHints
          (Prog *this,vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,int begin,
          int end)

{
  Inst *this_00;
  uint16_t *puVar1;
  pointer pIVar2;
  uint lo;
  uint hi;
  int iVar3;
  bool bVar4;
  int foldlo;
  int foldhi;
  int local_488;
  int first;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *local_480;
  Bitmap256 local_478;
  anon_class_32_4_bbdeb633 Recolor;
  int colors [256];
  
  local_478.words_[2] = 0;
  local_478.words_[3] = 0;
  local_478.words_[0] = 0;
  local_478.words_[1] = 0;
  bVar4 = false;
  local_488 = end;
  local_480 = flat;
  do {
    if (local_488 < begin) {
      return;
    }
    if (local_488 == end) {
LAB_001f3aeb:
      if (bVar4) {
        local_478.words_[0] = 0;
        local_478.words_[1] = 0;
        local_478.words_[2] = 0;
        local_478.words_[3] = 0x8000000000000000;
      }
      else {
        local_478.words_[3] = local_478.words_[3] | 0x8000000000000000;
      }
      bVar4 = false;
      colors[0xff] = local_488;
    }
    else {
      pIVar2 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl
               .super__Vector_impl_data._M_start;
      if ((pIVar2[local_488].out_opcode_ & 7) != 2) goto LAB_001f3aeb;
      this_00 = pIVar2 + local_488;
      Recolor.splits = &local_478;
      Recolor.colors = &colors;
      Recolor.first = &first;
      first = end;
      Recolor.id = &local_488;
      lo = Inst::lo(this_00);
      hi = Inst::hi(this_00);
      ComputeHints::anon_class_32_4_bbdeb633::operator()(&Recolor,lo,hi);
      iVar3 = Inst::foldcase(this_00);
      if (((0x60 < (int)hi) && ((int)lo < 0x7b)) && (iVar3 != 0)) {
        if ((int)lo < 0x62) {
          lo = 0x61;
        }
        if (0x79 < hi) {
          hi = 0x7a;
        }
        if (lo <= hi) {
          ComputeHints::anon_class_32_4_bbdeb633::operator()(&Recolor,lo - 0x20,hi - 0x20);
        }
      }
      if (first != end) {
        iVar3 = first - local_488;
        if (0x7ffe < iVar3) {
          iVar3 = 0x7fff;
        }
        puVar1 = &(this_00->field_1).field_3.hint_foldcase_;
        *puVar1 = *puVar1 | (short)iVar3 * 2;
      }
      bVar4 = true;
      flat = local_480;
    }
    local_488 = local_488 + -1;
  } while( true );
}

Assistant:

void Prog::ComputeHints(std::vector<Inst>* flat, int begin, int end) {
  Bitmap256 splits;
  int colors[256];

  bool dirty = false;
  for (int id = end; id >= begin; --id) {
    if (id == end ||
        (*flat)[id].opcode() != kInstByteRange) {
      if (dirty) {
        dirty = false;
        splits.Clear();
      }
      splits.Set(255);
      colors[255] = id;
      // At this point, the [0-255] range is colored with id.
      // Thus, hints cannot point beyond id; and if id == end,
      // hints that would have pointed to id will be 0 instead.
      continue;
    }
    dirty = true;

    // We recolor the [lo-hi] range with id. Note that first ratchets backwards
    // from end to the nearest conflict (if any) during recoloring.
    int first = end;
    auto Recolor = [&](int lo, int hi) {
      // Like ByteMapBuilder, we split at lo-1 and at hi.
      --lo;

      if (0 <= lo && !splits.Test(lo)) {
        splits.Set(lo);
        int next = splits.FindNextSetBit(lo+1);
        colors[lo] = colors[next];
      }
      if (!splits.Test(hi)) {
        splits.Set(hi);
        int next = splits.FindNextSetBit(hi+1);
        colors[hi] = colors[next];
      }

      int c = lo+1;
      while (c < 256) {
        int next = splits.FindNextSetBit(c);
        // Ratchet backwards...
        first = std::min(first, colors[next]);
        // Recolor with id - because it's the new nearest conflict!
        colors[next] = id;
        if (next == hi)
          break;
        c = next+1;
      }
    };

    Inst* ip = &(*flat)[id];
    int lo = ip->lo();
    int hi = ip->hi();
    Recolor(lo, hi);
    if (ip->foldcase() && lo <= 'z' && hi >= 'a') {
      int foldlo = lo;
      int foldhi = hi;
      if (foldlo < 'a')
        foldlo = 'a';
      if (foldhi > 'z')
        foldhi = 'z';
      if (foldlo <= foldhi) {
        foldlo += 'A' - 'a';
        foldhi += 'A' - 'a';
        Recolor(foldlo, foldhi);
      }
    }

    if (first != end) {
      uint16_t hint = static_cast<uint16_t>(std::min(first - id, 32767));
      ip->hint_foldcase_ |= hint<<1;
    }
  }
}